

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O2

void __thiscall
OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::swap
          (PropertyT<OpenMesh::VectorT<double,_3>_> *this,size_t _i0,size_t _i1)

{
  pointer pVVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  VectorT<double,_3> __tmp;
  
  pVVar1 = (this->data_).
           super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar2 = pVVar1[_i0].super_VectorDataT<double,_3>.values_[2];
  dVar3 = pVVar1[_i0].super_VectorDataT<double,_3>.values_[0];
  dVar4 = pVVar1[_i0].super_VectorDataT<double,_3>.values_[1];
  pVVar1[_i0].super_VectorDataT<double,_3>.values_[2] =
       pVVar1[_i1].super_VectorDataT<double,_3>.values_[2];
  dVar5 = pVVar1[_i1].super_VectorDataT<double,_3>.values_[1];
  pVVar1[_i0].super_VectorDataT<double,_3>.values_[0] =
       pVVar1[_i1].super_VectorDataT<double,_3>.values_[0];
  pVVar1[_i0].super_VectorDataT<double,_3>.values_[1] = dVar5;
  pVVar1[_i1].super_VectorDataT<double,_3>.values_[2] = dVar2;
  pVVar1[_i1].super_VectorDataT<double,_3>.values_[0] = dVar3;
  pVVar1[_i1].super_VectorDataT<double,_3>.values_[1] = dVar4;
  return;
}

Assistant:

virtual void swap(size_t _i0, size_t _i1)
  { std::swap(data_[_i0], data_[_i1]); }